

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  pointer *__ptr;
  long lVar2;
  long *local_378;
  clock_t local_370;
  thread local_368;
  clock_t end;
  thread threads [100];
  
  memset(threads,0,800);
  local_370 = clock();
  end = clock();
  for (lVar2 = 0; lVar2 != 800; lVar2 = lVar2 + 8) {
    local_368._M_id._M_thread = (id)0;
    local_378 = (long *)operator_new(0x10);
    *local_378 = (long)&PTR___State_00104d68;
    local_378[1] = (long)&end;
    std::thread::_M_start_thread(&local_368,&local_378,0);
    if (local_378 != (long *)0x0) {
      (**(code **)(*local_378 + 8))();
    }
    std::thread::operator=((thread *)((long)&threads[0]._M_id._M_thread + lVar2),&local_368);
    std::thread::~thread(&local_368);
  }
  for (lVar2 = 0; lVar2 != 800; lVar2 = lVar2 + 8) {
    std::thread::join();
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Result = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Time usage = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"ms\n");
  getchar();
  lVar2 = 0x318;
  do {
    std::thread::~thread((thread *)((long)&threads[0]._M_id._M_thread + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return 0;
}

Assistant:

int main() {
	std::thread threads[MAX_THREADS]; 
    clock_t start = clock();
    clock_t end = clock(); 

    for(int i = 0;i < MAX_THREADS; i++)
    {
	    threads[i] = std::thread([&](){
			    
			    while(count <= 1000000)
			    {

			    g_mutex.lock(); 
			    count ++; 
			    if (count > MAX_LOOPS)
			    {
			    end = clock(); 
			    }
			    g_mutex.unlock(); 
			    }
			    
			    }); 

    }

    for(int i = 0;i < MAX_THREADS; i++)
    {
	    threads[i].join(); 
    }
    
    std::cout << "Result = " << count << endl;
    std::cout << "Time usage = " << end - start << "ms\n";
//system("pause");
    getchar(); 
    return 0;
}